

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatencyEncodingSynapse.cpp
# Opt level: O3

void __thiscall LatencyEncodingSynapse::update(LatencyEncodingSynapse *this)

{
  Population *pPVar1;
  LatencyEncodingSynapse_param *pLVar2;
  long lVar3;
  double *pdVar4;
  pointer ppEVar5;
  Event *pEVar6;
  Clock *pCVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  
  if (0 < this->inputSize) {
    iVar9 = 0;
    do {
      resetOutput(this);
      if (0 < (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows) {
        uVar10 = 0;
        do {
          dVar12 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data[uVar10];
          dVar11 = Clock::getCurrentTime(this->clock);
          if (dVar11 < dVar12) {
LAB_00114d10:
            pEVar6 = (Event *)operator_new(0x18);
            pEVar6->_vptr_Event = (_func_int **)&PTR_setWeight_00122a58;
            pEVar6->type = No;
            pCVar7 = Clock::getInstance();
            dVar12 = Clock::getCurrentTime(pCVar7);
            pEVar6->eventTime = dVar12;
            (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10] = pEVar6;
          }
          else {
            if ((this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows <= (long)uVar10) {
LAB_00114e36:
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0x1a9,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            if ((this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[uVar10] <= -1.0) goto LAB_00114d10;
            pEVar6 = (Event *)operator_new(0x28);
            pEVar6->_vptr_Event = (_func_int **)&PTR_setWeight_00122a08;
            *(undefined4 *)&pEVar6[1]._vptr_Event = 1;
            *(undefined8 *)&pEVar6[1].type = 0x3ff0000000000000;
            pEVar6->type = Spike;
            pCVar7 = Clock::getInstance();
            dVar12 = Clock::getCurrentTime(pCVar7);
            pEVar6->eventTime = dVar12;
            (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10] = pEVar6;
            (**(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10]->_vptr_Event)(0x4094500000000000);
            if ((this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows <= (long)uVar10) goto LAB_00114e36;
            (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data[uVar10] = -1.0;
          }
          pPVar1 = (this->super_Synapse).to_population;
          (*pPVar1->_vptr_Population[5])
                    (pPVar1,uVar10 & 0xffffffff,
                     (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10]);
          Logging::logEvent(this->logger,(long)this,(int)uVar10,
                            (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar10]->type);
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 <
                 (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows);
      }
      dVar12 = this->currentWindow;
      dVar11 = Clock::getCurrentTime(this->clock);
      if (dVar12 <= dVar11) {
        pLVar2 = this->param;
        lVar3 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        if (0 < lVar3) {
          pdVar4 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data;
          ppEVar5 = (((this->super_Synapse).from_population)->output).
                    super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar8 = 0;
          do {
            dVar12 = pLVar2->window_length_s;
            dVar11 = ((double)ppEVar5[lVar8][1]._vptr_Event * 0.8 + 0.1) * dVar12;
            dVar12 = dVar12 * 0.9;
            if (dVar11 <= dVar12) {
              dVar12 = dVar11;
            }
            pdVar4[lVar8] = (double)(~-(ulong)(dVar11 < 0.0) & (ulong)dVar12) + this->currentWindow;
            lVar8 = lVar8 + 1;
          } while (lVar3 != lVar8);
        }
        this->currentWindow = pLVar2->window_length_s + this->currentWindow;
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < this->inputSize);
  }
  return;
}

Assistant:

void LatencyEncodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        resetOutput();
        for(int j = 0; j < spikeTimes.size(); j++) {
            if(spikeTimes(j) <= clock->getCurrentTime() && spikeTimes(j) > -1) {
                output[j] = new SpikeEvent();
                output[j]->setWeight(1300.0);
                spikeTimes(j) = -1;
            }
            else {
                output[j] = new NoEvent();
            }
            to_population->setInput(j, output[j]);
            logger->logEvent((long)this, j, output[j]->type);
        }
        if(currentWindow <= clock->getCurrentTime()) {
            for(int j = 0; j < spikeTimes.size(); j++) {
                double scaledValue = 0.1 + static_cast<ValueEvent*>(from_population->output[j])->value * 0.8;
                double vs = scaledValue * param->window_length_s;
                spikeTimes(j) = currentWindow + helperFunctions::clamp(vs, 0, param->window_length_s*0.9);
            }
            currentWindow += param->window_length_s;
        }
    }
}